

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphBase.h
# Opt level: O1

Graph * GraphBase::load_graph
                  (Graph *__return_storage_ptr__,string *graphName,bool isReverse,string *probDist,
                  float probEdge)

{
  pointer pcVar1;
  pointer pvVar2;
  pointer ppVar3;
  int iVar4;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *nbrs;
  time_t tVar5;
  pointer ppVar6;
  pair<unsigned_int,_float> *nbr_4;
  pointer pvVar7;
  long lVar8;
  Graph *__range3;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *nbrs_4;
  pointer pvVar9;
  undefined1 auVar10 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> vecInDeg;
  allocator_type local_79;
  pointer local_78;
  Graph *local_70;
  string local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_78 = (pointer)CONCAT44(local_78._4_4_,probEdge);
  (__return_storage_ptr__->
  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = (graphName->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + graphName->_M_string_length);
  IOcontroller::load_graph_struct(&local_68,__return_storage_ptr__,isReverse);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  iVar4 = tolower((int)*(probDist->_M_dataplus)._M_p);
  if (iVar4 == 0x74) {
    dsfmt_chk_init_gen_rand(&dsfmt_global_data,0,0x4de1);
    pvVar9 = (__return_storage_ptr__->
             super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_78 = (__return_storage_ptr__->
               super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    local_70 = __return_storage_ptr__;
    if (pvVar9 != local_78) {
      do {
        ppVar3 = (pvVar9->
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar6 = (pvVar9->
                      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      )._M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar3;
            ppVar6 = ppVar6 + 1) {
          if (0x17d < dsfmt_global_data.idx) {
            dsfmt_gen_rand_all(&dsfmt_global_data);
            dsfmt_global_data.idx = 0;
          }
          lVar8 = (long)dsfmt_global_data.idx;
          dsfmt_global_data.idx = dsfmt_global_data.idx + 1;
          ppVar6->second =
               *(float *)(&DAT_001342cc +
                         (ulong)(*(uint *)((long)dsfmt_global_data.status + lVar8 * 8) % 3) * 4);
        }
        pvVar9 = pvVar9 + 1;
      } while (pvVar9 != local_78);
    }
    tVar5 = time((time_t *)0x0);
    dsfmt_chk_init_gen_rand(&dsfmt_global_data,(uint32_t)tVar5,0x4de1);
    __return_storage_ptr__ = local_70;
  }
  else if (iVar4 == 0x75) {
    pvVar9 = (__return_storage_ptr__->
             super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (__return_storage_ptr__->
             super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (; pvVar9 != pvVar2; pvVar9 = pvVar9 + 1) {
      ppVar3 = (pvVar9->
               super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar6 = (pvVar9->
                    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar3;
          ppVar6 = ppVar6 + 1) {
        ppVar6->second = local_78._0_4_;
      }
    }
  }
  else if (iVar4 == 0x77) {
    if (isReverse) {
      pvVar2 = (__return_storage_ptr__->
               super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pvVar9 = (__return_storage_ptr__->
                    super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pvVar9 != pvVar2;
          pvVar9 = pvVar9 + 1) {
        ppVar6 = (pvVar9->
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        ppVar3 = (pvVar9->
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (ppVar6 != ppVar3) {
          lVar8 = (long)ppVar3 - (long)ppVar6 >> 3;
          auVar10._8_4_ = (int)((long)ppVar3 - (long)ppVar6 >> 0x23);
          auVar10._0_8_ = lVar8;
          auVar10._12_4_ = 0x45300000;
          do {
            ppVar6->second =
                 (float)(1.0 / ((auVar10._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)));
            ppVar6 = ppVar6 + 1;
          } while (ppVar6 != ppVar3);
        }
      }
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_48,
                 ((long)(__return_storage_ptr__->
                        super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(__return_storage_ptr__->
                        super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
                 &local_79);
      pvVar2 = (__return_storage_ptr__->
               super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pvVar9 = (__return_storage_ptr__->
               super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      for (pvVar7 = pvVar9; pvVar7 != pvVar2; pvVar7 = pvVar7 + 1) {
        ppVar3 = (pvVar7->
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar6 = (pvVar7->
                      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      )._M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar3;
            ppVar6 = ppVar6 + 1) {
          local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[ppVar6->first] =
               local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[ppVar6->first] + 1;
        }
      }
      for (; pvVar9 != pvVar2; pvVar9 = pvVar9 + 1) {
        ppVar3 = (pvVar9->
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar6 = (pvVar9->
                      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      )._M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar3;
            ppVar6 = ppVar6 + 1) {
          ppVar6->second =
               1.0 / (float)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start[ppVar6->first];
        }
      }
      if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static Graph load_graph(const std::string graphName, const bool isReverse, const std::string probDist = "load",
                            const float probEdge = float(0.1))
    {
        Graph graph;
        TIO::load_graph_struct(graphName, graph, isReverse);

        // Default is to load the edge including the diffusion probability from the file.
        // The following changes the setting of diffusion probability.
        if (tolower(probDist[0]) == 'w')
        {
            // Weighted cascade
            if (isReverse)
            {
                // Reverse graph
                for (auto& nbrs : graph)
                {
                    for (auto& nbr : nbrs)
                    {
                        nbr.second = float(1.0 / nbrs.size());
                    }
                }
            }
            else
            {
                // Forward graph
                std::vector<uint32_t> vecInDeg(graph.size());
                for (auto& nbrs : graph)
                {
                    for (auto& nbr : nbrs)
                    {
                        vecInDeg[nbr.first]++;
                    }
                }
                for (auto& nbrs : graph)
                {
                    for (auto& nbr : nbrs)
                    {
                        nbr.second = (float)1.0 / vecInDeg[nbr.first];
                    }
                }
            }

        }
        else if (tolower(probDist[0]) == 't')
        {
            // Trivalency cascade
            dsfmt_gv_init_gen_rand(0);
            float pProb[3] = {float(0.001), float(0.01), float(0.1)};
            for (auto& nbrs : graph)
            {
                for (auto& nbr : nbrs)
                {
                    nbr.second = pProb[dsfmt_gv_genrand_uint32_range(3)];
                }
            }
            dsfmt_gv_init_gen_rand(static_cast<uint32_t>(time(nullptr)));
        }
        else if (tolower(probDist[0]) == 'u')
        {
            // Uniform probability
            for (auto& nbrs : graph)
            {
                for (auto& nbr : nbrs)
                {
                    nbr.second = probEdge;
                }
            }
        }
        return graph;
    }